

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

int ShouldCompress(uint8_t *input,size_t input_size,size_t num_literals)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  uint32_t literal_histo [256];
  double local_458;
  int local_428 [256];
  
  auVar8._8_4_ = (int)(input_size >> 0x20);
  auVar8._0_8_ = input_size;
  auVar8._12_4_ = 0x45300000;
  dVar1 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar9._8_4_ = (int)(num_literals >> 0x20);
  auVar9._0_8_ = num_literals;
  auVar9._12_4_ = 0x45300000;
  uVar2 = 1;
  if (dVar1 * 0.98 <=
      (auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0)) {
    memset(local_428,0,0x400);
    if (input_size != 0) {
      uVar3 = 0;
      do {
        local_428[input[uVar3]] = local_428[input[uVar3]] + 1;
        uVar3 = uVar3 + 0x2b;
      } while (uVar3 < input_size);
    }
    dVar11 = 0.0;
    uVar6 = 0xfffffffffffffff8;
    uVar3 = 0;
    do {
      uVar2 = *(uint *)((long)local_428 + uVar6 + 8);
      uVar4 = (ulong)uVar2;
      if (uVar4 < 0x100) {
        dVar12 = (double)kLog2Table[uVar4];
        local_458 = (double)(int)uVar2;
      }
      else {
        local_458 = (double)uVar4;
        dVar12 = log2(local_458);
      }
      uVar5 = (ulong)*(uint *)((long)local_428 + uVar6 + 0xc);
      if (uVar5 < 0x100) {
        dVar7 = (double)kLog2Table[uVar5];
      }
      else {
        dVar7 = log2((double)uVar5);
      }
      uVar3 = uVar3 + uVar4 + uVar5;
      dVar11 = (dVar11 - local_458 * dVar12) - (double)uVar5 * dVar7;
      uVar6 = uVar6 + 8;
    } while (uVar6 < 0x3f8);
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    if (uVar3 != 0) {
      if (uVar3 < 0x100) {
        dVar7 = (double)kLog2Table[uVar3];
      }
      else {
        dVar7 = log2(dVar12);
      }
      dVar11 = dVar11 + dVar7 * dVar12;
    }
    if (dVar12 <= dVar11) {
      dVar12 = dVar11;
    }
    uVar2 = (uint)(dVar12 < (dVar1 * 8.0 * 0.98) / 43.0);
  }
  return uVar2;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* input, size_t input_size, size_t num_literals) {
  double corpus_size = (double)input_size;
  if (num_literals < MIN_RATIO * corpus_size) {
    return BROTLI_TRUE;
  } else {
    uint32_t literal_histo[256] = { 0 };
    const double max_total_bit_cost = corpus_size * 8 * MIN_RATIO / SAMPLE_RATE;
    size_t i;
    for (i = 0; i < input_size; i += SAMPLE_RATE) {
      ++literal_histo[input[i]];
    }
    return TO_BROTLI_BOOL(BitsEntropy(literal_histo, 256) < max_total_bit_cost);
  }
}